

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datareader.cpp
# Opt level: O0

int __thiscall ncnn::DataReaderFromMemory::scan(DataReaderFromMemory *this,char *format,void *p)

{
  size_t sVar1;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  int nscan;
  int nconsumed;
  char *format_with_n;
  int fmtlen;
  int local_44;
  int local_2c;
  char *local_28;
  int local_1c;
  undefined8 local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = strlen(in_RSI);
  local_1c = (int)sVar1;
  local_28 = (char *)operator_new__((long)(local_1c + 3));
  sprintf(local_28,"%s%%n",local_10);
  local_2c = 0;
  local_44 = __isoc99_sscanf(**(undefined8 **)(in_RDI + 8),local_28,local_18,&local_2c);
  **(long **)(in_RDI + 8) = **(long **)(in_RDI + 8) + (long)local_2c;
  if (local_28 != (char *)0x0) {
    operator_delete__(local_28);
  }
  if (local_2c < 1) {
    local_44 = 0;
  }
  return local_44;
}

Assistant:

int DataReaderFromMemory::scan(const char* format, void* p) const
{
    int fmtlen = strlen(format);

    char* format_with_n = new char[fmtlen + 3];
    sprintf(format_with_n, "%s%%n", format);

    int nconsumed = 0;
    int nscan = sscanf((const char*)mem, format_with_n, p, &nconsumed);
    mem += nconsumed;

    delete[] format_with_n;

    return nconsumed > 0 ? nscan : 0;
}